

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

size_t decode_ber_longform_integer(uint8_t *buf,long *decoded_integer,int max_len)

{
  bool bVar1;
  undefined8 local_28;
  long running_length;
  int i;
  int max_len_local;
  long *decoded_integer_local;
  uint8_t *buf_local;
  
  running_length._0_4_ = 1;
  local_28 = 0;
  decoded_integer_local = (long *)buf;
  while( true ) {
    bVar1 = false;
    if ((0x7f < (byte)*decoded_integer_local) && (bVar1 = false, (int)running_length < max_len)) {
      bVar1 = local_28 < 0x7fffffff;
    }
    if (!bVar1) break;
    local_28 = ((int)((byte)*decoded_integer_local & 0x7f) + local_28) * 0x80;
    decoded_integer_local = (long *)((long)decoded_integer_local + 1);
    running_length._0_4_ = (int)running_length + 1;
  }
  *decoded_integer = (ulong)(byte)*decoded_integer_local + local_28;
  return (long)(int)running_length;
}

Assistant:

static size_t decode_ber_longform_integer(const uint8_t* buf, long* decoded_integer, int max_len){
    int i = 1;
    long running_length = 0;
    while(*buf >= 128 && i < max_len && running_length < INT_MAX){
        running_length += *buf & 0x7F;
        running_length *= 128;
        buf++;
        i++;
    }
    running_length += *buf; // the lone byte
    *decoded_integer = running_length;
    return i;
}